

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader capnp::DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Reader *reader)

{
  ArrayPtr<const_unsigned_char> AVar1;
  bool bVar2;
  Fault local_70;
  Fault f;
  Type *local_60;
  undefined1 local_58 [8];
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Reader *reader_local;
  size_t sStack_10;
  
  if (reader->type == TEXT) {
    join_0x00000010_0x00000000_ =
         kj::StringPtr::asBytes(&(reader->field_1).textValue.super_StringPtr);
    Data::Reader::Reader
              ((Reader *)&reader_local,(ArrayPtr<const_unsigned_char> *)&_kjCondition.result);
  }
  else {
    local_60 = (Type *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&reader->type);
    f.exception._4_4_ = 7;
    kj::_::DebugExpression<capnp::DynamicValue::Type_const&>::operator==
              ((DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)
               local_58,(DebugExpression<capnp::DynamicValue::Type_const&> *)&local_60,
               (Type *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar2) {
      reader_local = (Reader *)(reader->field_1).anyPointerValue.reader.segment;
      sStack_10 = (reader->field_1).textValue.super_StringPtr.content.size_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x74b,FAILED,"reader.type == DATA","_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)
                 local_58,(char (*) [21])"Value type mismatch.");
      reader_local = (Reader *)0x0;
      sStack_10 = 0;
      Data::Reader::Reader((Reader *)&reader_local);
      kj::_::Debug::Fault::~Fault(&local_70);
    }
  }
  AVar1.size_ = sStack_10;
  AVar1.ptr = (uchar *)reader_local;
  return (Reader)AVar1;
}

Assistant:

Data::Reader DynamicValue::Reader::AsImpl<Data>::apply(const Reader& reader) {
  if (reader.type == TEXT) {
    // Coerce text to data.
    return reader.textValue.asBytes();
  }
  KJ_REQUIRE(reader.type == DATA, "Value type mismatch.") {
    return Data::Reader();
  }
  return reader.dataValue;
}